

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nng.c
# Opt level: O0

int nng_listen(nng_socket sid,char *addr,nng_listener *lp,int flags)

{
  uint32_t uVar1;
  nni_listener *pnStack_38;
  nng_listener lid;
  nni_listener *l;
  nni_sock *s;
  int rv;
  int flags_local;
  nng_listener *lp_local;
  char *addr_local;
  nng_socket sid_local;
  
  s._4_4_ = flags;
  _rv = lp;
  lp_local = (nng_listener *)addr;
  addr_local._0_4_ = sid.id;
  s._0_4_ = nni_sock_find((nni_sock **)&l,sid.id);
  addr_local._4_4_ = (int)s;
  if ((int)s == 0) {
    s._0_4_ = nni_listener_create(&stack0xffffffffffffffc8,(nni_sock *)l,(char *)lp_local);
    if ((int)s == 0) {
      s._0_4_ = nni_listener_start(pnStack_38,s._4_4_);
      if ((int)s == 0) {
        if (_rv != (nng_listener *)0x0) {
          uVar1 = nni_listener_id(pnStack_38);
          _rv->id = uVar1;
        }
        nni_listener_rele(pnStack_38);
        addr_local._4_4_ = (int)s;
      }
      else {
        nni_listener_close(pnStack_38);
        addr_local._4_4_ = (int)s;
      }
    }
    else {
      nni_sock_rele((nni_sock *)l);
      addr_local._4_4_ = (int)s;
    }
  }
  return addr_local._4_4_;
}

Assistant:

int
nng_listen(nng_socket sid, const char *addr, nng_listener *lp, int flags)
{
	int           rv;
	nni_sock     *s;
	nni_listener *l;

	if ((rv = nni_sock_find(&s, sid.id)) != 0) {
		return (rv);
	}
	if ((rv = nni_listener_create(&l, s, addr)) != 0) {
		nni_sock_rele(s);
		return (rv);
	}
	if ((rv = nni_listener_start(l, flags)) != 0) {
		nni_listener_close(l);
		return (rv);
	}

	if (lp != NULL) {
		nng_listener lid;
		lid.id = nni_listener_id(l);
		*lp    = lid;
	}
	nni_listener_rele(l);
	return (rv);
}